

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::TransformPromiseNodeBase::getDepResult
          (TransformPromiseNodeBase *this,ExceptionOrValue *output)

{
  PromiseArenaMember *node;
  Exception *e;
  Exception *exception;
  NullableValue<kj::Exception> _exception2498;
  
  (*(((this->dependency).ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember[3])();
  node = &((this->dependency).ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->dependency).ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  if ((output->exception).ptr.isSet == true) {
    Exception::addTrace(&(output->exception).ptr.field_1.value,this->continuationTracePtr);
  }
  return;
}

Assistant:

void TransformPromiseNodeBase::getDepResult(ExceptionOrValue& output) {
  dependency->get(output);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    dependency = nullptr;
  })) {
    output.addException(kj::mv(exception));
  }

  KJ_IF_SOME(e, output.exception) {
    e.addTrace(continuationTracePtr);
  }
}